

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseArgumentsCommand.h
# Opt level: O0

cmCommand * __thiscall cmParseArgumentsCommand::Clone(cmParseArgumentsCommand *this)

{
  cmCommand *this_00;
  cmParseArgumentsCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmParseArgumentsCommand((cmParseArgumentsCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmParseArgumentsCommand; }